

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

BindingMap * __thiscall r_exec::BindingMap::get_atom_variable(BindingMap *this,Atom *a)

{
  ulong uVar1;
  uint uVar2;
  size_type sVar3;
  reference this_00;
  Value *pVVar4;
  AtomValue *this_01;
  undefined4 *in_RDX;
  undefined4 local_54;
  P<r_exec::Value> local_50;
  size_type local_48;
  uint64_t size;
  undefined4 local_2c;
  ulong local_28;
  uint64_t i;
  Atom *a_local;
  BindingMap *this_local;
  
  local_28 = 0;
  a_local = a;
  this_local = this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                      ((vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_> *)
                       (a + 0x10));
    if (sVar3 <= uVar1) {
      local_48 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::size
                           ((vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>
                             *)(a + 0x10));
      this_01 = (AtomValue *)operator_new(0x20);
      local_54 = *in_RDX;
      AtomValue::AtomValue(this_01,(BindingMap *)a,(Atom *)&local_54);
      core::P<r_exec::Value>::P(&local_50,(Value *)this_01);
      std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::push_back
                ((vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_> *)
                 (a + 0x10),&local_50);
      core::P<r_exec::Value>::~P(&local_50);
      r_code::Atom::~Atom((Atom *)&local_54);
      r_code::Atom::VLPointer((ushort)this,(ushort)local_48);
      return this;
    }
    this_00 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::
              operator[]((vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_> *
                         )(a + 0x10),local_28);
    pVVar4 = core::P<r_exec::Value>::operator->(this_00);
    local_2c = *in_RDX;
    uVar2 = (*(pVVar4->super__Object)._vptr__Object[0xc])(pVVar4,&local_2c);
    r_code::Atom::~Atom((Atom *)&local_2c);
    if ((uVar2 & 1) != 0) break;
    local_28 = local_28 + 1;
  }
  r_code::Atom::VLPointer((ushort)this,(ushort)local_28);
  return this;
}

Assistant:

Atom BindingMap::get_atom_variable(Atom a)
{
    for (uint64_t i = 0; i < map.size(); ++i) {
        if (map[i]->contains(a)) {
            return Atom::VLPointer(i);
        }
    }

    uint64_t size = map.size();
    map.push_back(new AtomValue(this, a));
    return Atom::VLPointer(size);
}